

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringsTest.cc
# Opt level: O2

void print_data_test_case<std::__cxx11::string,long,char_const*,int>
               (string *expected_output,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,long args_1,
               char *args_2,int args_3)

{
  __type _Var1;
  allocator<char> local_82;
  allocator<char> local_81;
  string output_data;
  string local_60;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_data,"StringsTest-data",&local_81);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"w",&local_82);
  phosg::fopen_unique((phosg *)&f,(string *)&output_data,&local_60,(FILE *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&output_data);
  phosg::print_data(f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
                    super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
                    super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,args,args_1,args_2,
                    (long)args_3);
  std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"StringsTest-data",(allocator<char> *)&f);
  phosg::load_file((string *)&output_data,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  _Var1 = std::operator==(expected_output,&output_data);
  if (!_Var1) {
    fputs("(print_data) Expected:\n",_stderr);
    fwrite((expected_output->_M_dataplus)._M_p,1,expected_output->_M_string_length,_stderr);
    fputs("(print_data) Actual:\n",_stderr);
    fwrite(output_data._M_dataplus._M_p,1,output_data._M_string_length,_stderr);
    phosg::expect_generic
              (false,"!(false)",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
               ,0x1d);
  }
  phosg::format_data((string *)&local_60,args,args_1,args_2,(long)args_3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&output_data,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  _Var1 = std::operator==(expected_output,&output_data);
  if (!_Var1) {
    fputs("(format_data) Expected:\n",_stderr);
    fwrite((expected_output->_M_dataplus)._M_p,1,expected_output->_M_string_length,_stderr);
    fputs("(format_data) Actual:\n",_stderr);
    fwrite(output_data._M_dataplus._M_p,1,output_data._M_string_length,_stderr);
    phosg::expect_generic
              (false,"!(false)",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
               ,0x27);
  }
  std::__cxx11::string::~string((string *)&output_data);
  return;
}

Assistant:

void print_data_test_case(const string& expected_output, ArgTs... args) {

  // macOS doesn't have fmemopen, so we just write to a file because I'm too
  // lazy to use funopen()
  {
    auto f = fopen_unique("StringsTest-data", "w");
    print_data(f.get(), args...);
  }
  string output_data = load_file("StringsTest-data");

  if (expected_output != output_data) {
    fputs("(print_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(print_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }

  // Also test format_data - it should produce the same result
  output_data = format_data(args...);
  if (expected_output != output_data) {
    fputs("(format_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(format_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }
}